

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O0

CachedResourceView * __thiscall
Diligent::ShaderResourceCacheGL::GetConstImage(ShaderResourceCacheGL *this,Uint32 CacheOffset)

{
  Uint32 UVar1;
  Char *Message;
  pointer puVar2;
  char (*in_R8) [18];
  undefined1 local_38 [8];
  string msg;
  Uint32 CacheOffset_local;
  ShaderResourceCacheGL *this_local;
  
  msg.field_2._12_4_ = CacheOffset;
  UVar1 = GetImageCount(this);
  if (UVar1 <= CacheOffset) {
    FormatString<char[21],unsigned_int,char[18]>
              ((string *)local_38,(Diligent *)"Image buffer index (",
               (char (*) [21])((long)&msg.field_2 + 0xc),(uint *)") is out of range",in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetConstImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
               ,0x134);
    std::__cxx11::string::~string((string *)local_38);
  }
  puVar2 = std::
           unique_ptr<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
           ::get(&this->m_pResourceData);
  return (CachedResourceView *)
         (puVar2 + (ulong)(uint)msg.field_2._12_4_ * 0x18 + (long)(int)(uint)this->m_ImagesOffset);
}

Assistant:

const CachedResourceView& GetConstImage(Uint32 CacheOffset) const
    {
        VERIFY(CacheOffset < GetImageCount(), "Image buffer index (", CacheOffset, ") is out of range");
        return reinterpret_cast<CachedResourceView*>(m_pResourceData.get() + m_ImagesOffset)[CacheOffset];
    }